

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressionTables.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_36eda::LutHeaderWorker::run(LutHeaderWorker *this,bool outputProgress)

{
  float fVar1;
  ushort uVar2;
  ushort uVar3;
  size_t *psVar4;
  unsigned_short *puVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  ushort *puVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int i;
  ulong uVar13;
  bool bVar14;
  ulong uVar15;
  ulong uVar16;
  half candidate [16];
  ushort local_58 [20];
  
  uVar16 = this->_startValue;
  if (uVar16 < this->_endValue) {
    psVar4 = this->_offset;
    puVar5 = this->_elements;
    do {
      uVar2 = (&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)::numBitsSet)
              [(uint)uVar16 & 0xff];
      uVar3 = (&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)::numBitsSet)
              [(uint)(uVar16 >> 8) & 0xff];
      psVar4[uVar16 - this->_startValue] = this->_numElements;
      uVar15 = 0;
      uVar7 = (uint)uVar3 + (uint)uVar2;
      if (uVar7 != 0) {
        uVar8 = (ulong)uVar7;
        uVar15 = 0;
        uVar11 = 0;
        do {
          uVar7 = uVar7 - 1;
          uVar13 = 0;
          bVar14 = false;
          uVar10 = uVar11;
          do {
            uVar11 = uVar10;
            if ((uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)
                                ::numBitsSet)[uVar13 >> 8 & 0xffffff] +
                (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::countSetBits(unsigned_short)
                                ::numBitsSet)[uVar13 & 0xff] == uVar7) {
              if (bVar14) {
                fVar1 = *(float *)(_imath_half_to_float_table + (uVar16 & 0xffff) * 4);
                uVar11 = uVar13 & 0xffffffff;
                if (ABS(fVar1 - *(float *)(_imath_half_to_float_table + (uVar10 & 0xffff) * 4)) <=
                    ABS(fVar1 - *(float *)(_imath_half_to_float_table + uVar13 * 4))) {
                  uVar11 = uVar10;
                }
              }
              else {
                bVar14 = true;
                uVar11 = uVar13 & 0xffffffff;
              }
            }
            uVar13 = uVar13 + 1;
            uVar10 = uVar11;
          } while (uVar13 != 0x10000);
          local_58[uVar15] = (ushort)uVar11;
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar8);
      }
      uVar11 = uVar15 & 0xffffffff;
      if ((int)uVar15 != 0) {
        puVar9 = local_58;
        uVar8 = uVar11;
        uVar10 = 0;
        do {
          uVar13 = uVar10 + 1;
          if (uVar13 < uVar11) {
            uVar12 = 1;
            do {
              uVar2 = local_58[uVar10];
              uVar3 = puVar9[uVar12];
              if ((uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                  countSetBits(unsigned_short)::numBitsSet)[uVar3 >> 8] +
                  (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                  countSetBits(unsigned_short)::numBitsSet)[uVar3 & 0xff] <
                  (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                  countSetBits(unsigned_short)::numBitsSet)[uVar2 >> 8] +
                  (uint)(ushort)(&(anonymous_namespace)::LutHeaderWorker::
                                  countSetBits(unsigned_short)::numBitsSet)[uVar2 & 0xff]) {
                local_58[uVar10] = uVar3;
                puVar9[uVar12] = uVar2;
              }
              uVar12 = uVar12 + 1;
            } while (uVar8 != uVar12);
          }
          puVar9 = puVar9 + 1;
          uVar8 = uVar8 - 1;
          uVar10 = uVar13;
        } while (uVar13 != uVar11);
        sVar6 = this->_numElements;
        memcpy(puVar5 + sVar6,local_58,uVar11 * 2);
        this->_numElements = sVar6 + ((int)uVar15 - 1) + 1;
      }
      if (uVar16 == this->_endValue - 1) {
        this->_lastCandidateCount = uVar11;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < this->_endValue);
  }
  return;
}

Assistant:

void run (bool outputProgress)
    {
        half candidate[16];
        int  candidateCount = 0;

        for (size_t input = _startValue; input < _endValue; ++input)
        {

            int  numSetBits = countSetBits (input);
            half inputHalf, closestHalf;

            inputHalf.setBits (input);
            closestHalf.setBits (0);

            _offset[input - _startValue] = _numElements;

            // Gather candidates
            candidateCount = 0;
            for (int targetNumSetBits = numSetBits - 1; targetNumSetBits >= 0;
                 --targetNumSetBits)
            {
                bool valueFound = false;

                for (int i = 0; i < 65536; ++i)
                {
                    if (countSetBits (i) != targetNumSetBits) continue;

                    if (!valueFound)
                    {
                        closestHalf.setBits (i);
                        valueFound = true;
                    }
                    else
                    {
                        half tmpHalf;

                        tmpHalf.setBits (i);

                        if (fabs ((float) inputHalf - (float) tmpHalf) <
                            fabs ((float) inputHalf - (float) closestHalf))
                        {
                            closestHalf = tmpHalf;
                        }
                    }
                }

                candidate[candidateCount] = closestHalf;
                candidateCount++;
            }

            // Sort candidates by increasing number of bits set
            for (int i = 0; i < candidateCount; ++i)
            {
                for (int j = i + 1; j < candidateCount; ++j)
                {

                    int iCnt = countSetBits (candidate[i].bits ());
                    int jCnt = countSetBits (candidate[j].bits ());

                    if (jCnt < iCnt)
                    {
                        half tmp     = candidate[i];
                        candidate[i] = candidate[j];
                        candidate[j] = tmp;
                    }
                }
            }

            // Copy candidates to the data buffer;
            for (int i = 0; i < candidateCount; ++i)
            {
                _elements[_numElements] = candidate[i].bits ();
                _numElements++;
            }

            if (input == _endValue - 1)
            {
                _lastCandidateCount = candidateCount;
            }
        }
    }